

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> * __thiscall
ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::OpenMXFRead
          (TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *this,
          string *filename)

{
  bool bVar1;
  int iVar2;
  ILogSink *pIVar3;
  undefined8 in_RDX;
  undefined1 local_1d8 [208];
  undefined1 local_108 [231];
  undefined1 local_21;
  string *filename_local;
  TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *this_local;
  Result_t *result;
  
  filename[0x29]._M_string_length = 0;
  local_21 = 0;
  filename_local = filename;
  this_local = this;
  (**(code **)(**(long **)&filename->field_2 + 0x10))(this,*(long **)&filename->field_2,in_RDX);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    SeekToRIP((MXF *)(local_108 + 0x78),(IFileReader *)(filename->field_2)._M_allocated_capacity);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(local_108 + 0x78));
    Kumu::Result_t::~Result_t((Result_t *)(local_108 + 0x78));
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"TrackFileReader::OpenMXFRead, SeekToRIP failed\n");
  }
  else {
    RIP::InitFromFile((RIP *)local_108,(IFileReader *)(filename[0x1d].field_2._M_local_buf + 8));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_108);
    Kumu::Result_t::~Result_t((Result_t *)local_108);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"File contains no RIP\n");
    }
    else {
      bVar1 = std::__cxx11::
              list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
              ::empty((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                       *)((long)&filename[0x21].field_2 + 8));
      if (bVar1) {
        pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar3,"RIP contains no Pairs.\n");
      }
    }
  }
  (**(code **)(**(long **)&filename->field_2 + 0x28))
            (local_1d8 + 0x68,*(long **)&filename->field_2,0);
  Kumu::Result_t::~Result_t((Result_t *)(local_1d8 + 0x68));
  OP1aHeader::InitFromFile
            ((OP1aHeader *)local_1d8,(IFileReader *)((filename->field_2)._M_local_buf + 8));
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_1d8);
  Kumu::Result_t::~Result_t((Result_t *)local_1d8);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"TrackFileReader::OpenMXFRead, header init failed\n");
  }
  return this;
}

Assistant:

Result_t OpenMXFRead(const std::string& filename)
	{
	  m_LastPosition = 0;
	  Result_t result = m_File->OpenRead(filename);

	  if ( ASDCP_SUCCESS(result) )
        result = SeekToRIP(*m_File);

	  if ( ASDCP_SUCCESS(result) )
	    {
          result = m_RIP.InitFromFile(*m_File);

	      if ( ASDCP_FAILURE(result) )
		{
		  DefaultLogSink().Error("File contains no RIP\n");
		}
	      else if ( m_RIP.PairArray.empty() )
		{
		  DefaultLogSink().Error("RIP contains no Pairs.\n");
		}
	    }
	  else
	    {
	      DefaultLogSink().Error("TrackFileReader::OpenMXFRead, SeekToRIP failed\n");
	    }

      m_File->Seek(0);
      result = m_HeaderPart.InitFromFile(*m_File);

	  if ( KM_FAILURE(result) )
	    {
	      DefaultLogSink().Error("TrackFileReader::OpenMXFRead, header init failed\n");
	    }

	  return result;
	}